

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O0

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  U32 UVar1;
  uint uVar2;
  uint uVar3;
  U32 UVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  ZSTD_matchState_t *pZVar7;
  U32 *pUVar8;
  BYTE *pBVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  int iVar12;
  int iVar13;
  U32 UVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  U32 UVar19;
  U32 UVar20;
  uint uVar21;
  U32 UVar22;
  BYTE *pBVar23;
  BYTE *pBVar24;
  BYTE *pBVar25;
  size_t sVar26;
  BYTE *pBVar27;
  ulong uVar28;
  bool bVar29;
  U32 local_1244;
  U32 local_1240;
  BYTE *local_1228;
  BYTE *local_1218;
  BYTE *local_11c8;
  BYTE *local_11b8;
  U32 local_11a4;
  U32 local_11a0;
  BYTE *local_1188;
  BYTE *local_1178;
  BYTE *local_1128;
  BYTE *local_1118;
  U32 local_1104;
  U32 local_1100;
  BYTE *local_10e8;
  BYTE *local_10d8;
  BYTE *local_1088;
  BYTE *local_1078;
  U32 local_1064;
  U32 local_1060;
  BYTE *local_1048;
  BYTE *local_1038;
  BYTE *local_fe8;
  BYTE *local_fd8;
  U32 mls;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  U32 tmpOffset_3;
  size_t repLength2_3;
  BYTE *repEnd2_3;
  BYTE *repMatch2_3;
  U32 repIndex2_3;
  U32 current2_3;
  U32 offset_9;
  U32 offset_8;
  BYTE *dictMatch_3;
  U32 dictMatchIndex_3;
  size_t dictHash_3;
  BYTE *repMatchEnd_3;
  BYTE *repMatch_3;
  BYTE *pBStack_f28;
  U32 repIndex_3;
  BYTE *match_3;
  U32 matchIndex_3;
  U32 curr_3;
  size_t h_3;
  size_t mLength_3;
  U32 endIndex_3;
  U32 maxDistance_3;
  U32 dictHLog_3;
  U32 dictAndPrefixLength_3;
  U32 dictIndexDelta_3;
  BYTE *dictEnd_3;
  BYTE *dictStart_3;
  BYTE *dictBase_3;
  U32 dictStartIndex_3;
  U32 *dictHashTable_3;
  ZSTD_compressionParameters *dictCParams_3;
  ZSTD_matchState_t *dms_3;
  U32 local_eb0;
  U32 offsetSaved_3;
  U32 offset_2_3;
  U32 offset_1_3;
  BYTE *ilimit_3;
  BYTE *iend_3;
  BYTE *prefixStart_3;
  BYTE *pBStack_e88;
  U32 prefixStartIndex_3;
  BYTE *anchor_3;
  BYTE *ip_15;
  BYTE *istart_3;
  BYTE *base_3;
  U32 stepSize_3;
  U32 hlog_3;
  U32 *hashTable_3;
  ZSTD_compressionParameters *cParams_3;
  size_t local_e10;
  size_t local_df8;
  size_t local_de0;
  size_t local_dc8;
  size_t local_db0;
  U32 tmpOffset_2;
  size_t repLength2_2;
  BYTE *repEnd2_2;
  BYTE *repMatch2_2;
  U32 repIndex2_2;
  U32 current2_2;
  U32 offset_7;
  U32 offset_6;
  BYTE *dictMatch_2;
  U32 dictMatchIndex_2;
  size_t dictHash_2;
  BYTE *repMatchEnd_2;
  BYTE *repMatch_2;
  BYTE *pBStack_d48;
  U32 repIndex_2;
  BYTE *match_2;
  U32 matchIndex_2;
  U32 curr_2;
  size_t h_2;
  size_t mLength_2;
  U32 endIndex_2;
  U32 maxDistance_2;
  U32 dictHLog_2;
  U32 dictAndPrefixLength_2;
  U32 dictIndexDelta_2;
  BYTE *dictEnd_2;
  BYTE *dictStart_2;
  BYTE *dictBase_2;
  U32 dictStartIndex_2;
  U32 *dictHashTable_2;
  ZSTD_compressionParameters *dictCParams_2;
  ZSTD_matchState_t *dms_2;
  U32 local_cd0;
  U32 offsetSaved_2;
  U32 offset_2_2;
  U32 offset_1_2;
  BYTE *ilimit_2;
  BYTE *iend_2;
  BYTE *prefixStart_2;
  BYTE *pBStack_ca8;
  U32 prefixStartIndex_2;
  BYTE *anchor_2;
  BYTE *ip_10;
  BYTE *istart_2;
  BYTE *base_2;
  U32 stepSize_2;
  U32 hlog_2;
  U32 *hashTable_2;
  ZSTD_compressionParameters *cParams_2;
  size_t local_c30;
  size_t local_c18;
  size_t local_c00;
  size_t local_be8;
  size_t local_bd0;
  U32 tmpOffset_1;
  size_t repLength2_1;
  BYTE *repEnd2_1;
  BYTE *repMatch2_1;
  U32 repIndex2_1;
  U32 current2_1;
  U32 offset_5;
  U32 offset_4;
  BYTE *dictMatch_1;
  U32 dictMatchIndex_1;
  size_t dictHash_1;
  BYTE *repMatchEnd_1;
  BYTE *repMatch_1;
  BYTE *pBStack_b68;
  U32 repIndex_1;
  BYTE *match_1;
  U32 matchIndex_1;
  U32 curr_1;
  size_t h_1;
  size_t mLength_1;
  U32 endIndex_1;
  U32 maxDistance_1;
  U32 dictHLog_1;
  U32 dictAndPrefixLength_1;
  U32 dictIndexDelta_1;
  BYTE *dictEnd_1;
  BYTE *dictStart_1;
  BYTE *dictBase_1;
  U32 dictStartIndex_1;
  U32 *dictHashTable_1;
  ZSTD_compressionParameters *dictCParams_1;
  ZSTD_matchState_t *dms_1;
  U32 local_af0;
  U32 offsetSaved_1;
  U32 offset_2_1;
  U32 offset_1_1;
  BYTE *ilimit_1;
  BYTE *iend_1;
  BYTE *prefixStart_1;
  BYTE *pBStack_ac8;
  U32 prefixStartIndex_1;
  BYTE *anchor_1;
  BYTE *ip_5;
  BYTE *istart_1;
  BYTE *base_1;
  U32 stepSize_1;
  U32 hlog_1;
  U32 *hashTable_1;
  ZSTD_compressionParameters *cParams_1;
  size_t local_a50;
  size_t local_a38;
  size_t local_a20;
  size_t local_a08;
  size_t local_9f0;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  U32 current2;
  U32 offset_3;
  U32 offset;
  BYTE *dictMatch;
  U32 dictMatchIndex;
  size_t dictHash;
  BYTE *repMatchEnd;
  BYTE *repMatch;
  BYTE *pBStack_988;
  U32 repIndex;
  BYTE *match;
  U32 matchIndex;
  U32 curr;
  size_t h;
  size_t mLength;
  U32 endIndex;
  U32 maxDistance;
  U32 dictHLog;
  U32 dictAndPrefixLength;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  BYTE *dictStart;
  BYTE *dictBase;
  U32 dictStartIndex;
  U32 *dictHashTable;
  ZSTD_compressionParameters *dictCParams;
  ZSTD_matchState_t *dms;
  U32 local_910;
  U32 offsetSaved;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *prefixStart;
  BYTE *pBStack_8e8;
  U32 prefixStartIndex;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  BYTE *base;
  U32 stepSize;
  U32 hlog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  size_t local_870;
  size_t local_858;
  size_t local_840;
  size_t local_828;
  size_t local_810;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  BYTE *litEnd_3;
  BYTE *litLimit_w_3;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  BYTE *litEnd_4;
  BYTE *litLimit_w_4;
  BYTE *litEnd_5;
  BYTE *litLimit_w_5;
  BYTE *litEnd_7;
  BYTE *litLimit_w_7;
  BYTE *litEnd_6;
  BYTE *litLimit_w_6;
  BYTE *litEnd_8;
  BYTE *litLimit_w_8;
  BYTE *litEnd_9;
  BYTE *litLimit_w_9;
  BYTE *litEnd_11;
  BYTE *litLimit_w_11;
  BYTE *litEnd_10;
  BYTE *litLimit_w_10;
  BYTE *litEnd_12;
  BYTE *litLimit_w_12;
  BYTE *litEnd_13;
  BYTE *litLimit_w_13;
  BYTE *litEnd_15;
  BYTE *litLimit_w_15;
  BYTE *litEnd_14;
  BYTE *litLimit_w_14;
  BYTE *oend_14;
  BYTE *op_14;
  BYTE *ip_18;
  ptrdiff_t diff_14;
  BYTE *oend_15;
  BYTE *op_15;
  BYTE *ip_19;
  ptrdiff_t diff_15;
  BYTE *oend_13;
  BYTE *op_13;
  BYTE *ip_17;
  ptrdiff_t diff_13;
  BYTE *oend_12;
  BYTE *op_12;
  BYTE *ip_16;
  ptrdiff_t diff_12;
  BYTE *oend_10;
  BYTE *op_10;
  BYTE *ip_13;
  ptrdiff_t diff_10;
  BYTE *oend_11;
  BYTE *op_11;
  BYTE *ip_14;
  ptrdiff_t diff_11;
  BYTE *oend_9;
  BYTE *op_9;
  BYTE *ip_12;
  ptrdiff_t diff_9;
  BYTE *oend_8;
  BYTE *op_8;
  BYTE *ip_11;
  ptrdiff_t diff_8;
  BYTE *oend_6;
  BYTE *op_6;
  BYTE *ip_8;
  ptrdiff_t diff_6;
  BYTE *oend_7;
  BYTE *op_7;
  BYTE *ip_9;
  ptrdiff_t diff_7;
  BYTE *oend_5;
  BYTE *op_5;
  BYTE *ip_7;
  ptrdiff_t diff_5;
  BYTE *oend_4;
  BYTE *op_4;
  BYTE *ip_6;
  ptrdiff_t diff_4;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_3;
  ptrdiff_t diff_2;
  BYTE *oend_3;
  BYTE *op_3;
  BYTE *ip_4;
  ptrdiff_t diff_3;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  
  iVar12 = (int)src;
  switch((ms->cParams).minMatch) {
  default:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar15 = (ms->cParams).targetLength + (uint)(((ms->cParams).targetLength != 0 ^ 0xffU) & 1);
    pBVar6 = (ms->window).base;
    uVar2 = (ms->window).dictLimit;
    pBVar23 = pBVar6 + uVar2;
    pBVar24 = (BYTE *)((long)src + srcSize);
    pBVar25 = pBVar24 + -8;
    offsetSaved = *rep;
    local_910 = rep[1];
    pZVar7 = ms->dictMatchState;
    pUVar8 = pZVar7->hashTable;
    uVar3 = (pZVar7->window).dictLimit;
    pBVar9 = (pZVar7->window).base;
    pBVar10 = (pZVar7->window).nextSrc;
    uVar16 = uVar2 - ((int)pBVar10 - (int)pBVar9);
    UVar4 = (pZVar7->cParams).hashLog;
    iVar13 = (int)pBVar6;
    anchor = (BYTE *)((long)src +
                     (long)(int)(uint)((iVar12 - (int)pBVar23) + (int)pBVar10 ==
                                      (int)(pBVar9 + uVar3)));
    pBStack_8e8 = (BYTE *)src;
LAB_00273bf6:
    UVar14 = offsetSaved;
    if (anchor < pBVar25) {
      switch(0x273c60) {
      case 0:
        local_810 = ZSTD_hash4Ptr(anchor,UVar1);
        break;
      case 1:
        local_810 = ZSTD_hash5Ptr(anchor,UVar1);
        break;
      case 2:
        local_810 = ZSTD_hash6Ptr(anchor,UVar1);
        break;
      case 3:
        local_810 = ZSTD_hash7Ptr(anchor,UVar1);
        break;
      case 4:
        local_810 = ZSTD_hash8Ptr(anchor,UVar1);
      }
      uVar17 = (int)anchor - iVar13;
      uVar21 = pUVar5[local_810];
      pBStack_988 = pBVar6 + uVar21;
      uVar18 = (uVar17 + 1) - offsetSaved;
      if (uVar18 < uVar2) {
        local_fd8 = pBVar9 + (uVar18 - uVar16);
      }
      else {
        local_fd8 = pBVar6 + uVar18;
      }
      pUVar5[local_810] = uVar17;
      if ((uVar2 - 1) - uVar18 < 3) {
LAB_0027419e:
        if (uVar2 < uVar21) {
          UVar19 = MEM_read32(pBStack_988);
          UVar20 = MEM_read32(anchor);
          if (UVar19 == UVar20) {
            offsetSaved = (int)anchor - (int)pBStack_988;
            sVar26 = ZSTD_count(anchor + 4,pBStack_988 + 4,pBVar24);
            h = sVar26 + 4;
            while( true ) {
              bVar29 = false;
              if (pBStack_8e8 < anchor && pBVar23 < pBStack_988) {
                bVar29 = anchor[-1] == pBStack_988[-1];
              }
              if (!bVar29) break;
              anchor = anchor + -1;
              pBStack_988 = pBStack_988 + -1;
              h = h + 1;
            }
            uVar28 = (long)anchor - (long)pBStack_8e8;
            if (pBVar24 + -0x20 < pBStack_8e8 + uVar28) {
              ZSTD_safecopyLiterals(seqStore->lit,pBStack_8e8,pBStack_8e8 + uVar28,pBVar24 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,pBStack_8e8);
              if (0x10 < uVar28) {
                pBVar11 = seqStore->lit;
                pBVar27 = pBVar11 + 0x10;
                ZSTD_copy16(pBVar27,pBStack_8e8 + 0x10);
                if (0x10 < (long)(uVar28 - 0x10)) {
                  oend_2 = pBVar11 + 0x20;
                  do {
                    op_2 = pBStack_8e8 + 0x20;
                    ZSTD_copy16(oend_2,op_2);
                    ZSTD_copy16(oend_2 + 0x10,pBStack_8e8 + 0x30);
                    oend_2 = oend_2 + 0x20;
                    pBStack_8e8 = op_2;
                  } while (oend_2 < pBVar27 + (uVar28 - 0x10));
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar28;
            if (0xffff < uVar28) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar28;
            seqStore->sequences->offset = offsetSaved + 3;
            if (0xffff < h - 3) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(h - 3);
            seqStore->sequences = seqStore->sequences + 1;
LAB_00274c49:
            local_910 = UVar14;
            goto LAB_00274c4b;
          }
          anchor = anchor + ((long)anchor - (long)pBStack_8e8 >> 8) + (ulong)uVar15;
        }
        else {
          switch(0x274206) {
          case 0:
            local_828 = ZSTD_hash4Ptr(anchor,UVar4);
            break;
          case 1:
            local_828 = ZSTD_hash5Ptr(anchor,UVar4);
            break;
          case 2:
            local_828 = ZSTD_hash6Ptr(anchor,UVar4);
            break;
          case 3:
            local_828 = ZSTD_hash7Ptr(anchor,UVar4);
            break;
          case 4:
            local_828 = ZSTD_hash8Ptr(anchor,UVar4);
          }
          uVar21 = pUVar8[local_828];
          _offset_3 = pBVar9 + uVar21;
          if (uVar3 < uVar21) {
            UVar19 = MEM_read32(_offset_3);
            UVar20 = MEM_read32(anchor);
            if (UVar19 == UVar20) {
              offsetSaved = (uVar17 - uVar21) - uVar16;
              sVar26 = ZSTD_count_2segments(anchor + 4,_offset_3 + 4,pBVar24,pBVar10,pBVar23);
              h = sVar26 + 4;
              while( true ) {
                bVar29 = false;
                if (pBStack_8e8 < anchor && pBVar9 + uVar3 < _offset_3) {
                  bVar29 = anchor[-1] == _offset_3[-1];
                }
                if (!bVar29) break;
                anchor = anchor + -1;
                _offset_3 = _offset_3 + -1;
                h = h + 1;
              }
              uVar28 = (long)anchor - (long)pBStack_8e8;
              if (pBVar24 + -0x20 < pBStack_8e8 + uVar28) {
                ZSTD_safecopyLiterals
                          (seqStore->lit,pBStack_8e8,pBStack_8e8 + uVar28,pBVar24 + -0x20);
              }
              else {
                ZSTD_copy16(seqStore->lit,pBStack_8e8);
                if (0x10 < uVar28) {
                  pBVar11 = seqStore->lit;
                  pBVar27 = pBVar11 + 0x10;
                  ZSTD_copy16(pBVar27,pBStack_8e8 + 0x10);
                  if (0x10 < (long)(uVar28 - 0x10)) {
                    oend_1 = pBVar11 + 0x20;
                    do {
                      op_1 = pBStack_8e8 + 0x20;
                      ZSTD_copy16(oend_1,op_1);
                      ZSTD_copy16(oend_1 + 0x10,pBStack_8e8 + 0x30);
                      oend_1 = oend_1 + 0x20;
                      pBStack_8e8 = op_1;
                    } while (oend_1 < pBVar27 + (uVar28 - 0x10));
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar28;
              if (0xffff < uVar28) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->litLength = (U16)uVar28;
              seqStore->sequences->offset = offsetSaved + 3;
              if (0xffff < h - 3) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->matchLength = (U16)(h - 3);
              seqStore->sequences = seqStore->sequences + 1;
              goto LAB_00274c49;
            }
          }
          anchor = anchor + ((long)anchor - (long)pBStack_8e8 >> 8) + (ulong)uVar15;
        }
      }
      else {
        UVar19 = MEM_read32(local_fd8);
        UVar20 = MEM_read32(anchor + 1);
        if (UVar19 != UVar20) goto LAB_0027419e;
        local_fe8 = pBVar24;
        if (uVar18 < uVar2) {
          local_fe8 = pBVar10;
        }
        sVar26 = ZSTD_count_2segments(anchor + 5,local_fd8 + 4,pBVar24,local_fe8,pBVar23);
        h = sVar26 + 4;
        anchor = anchor + 1;
        uVar28 = (long)anchor - (long)pBStack_8e8;
        if (pBVar24 + -0x20 < pBStack_8e8 + uVar28) {
          ZSTD_safecopyLiterals(seqStore->lit,pBStack_8e8,pBStack_8e8 + uVar28,pBVar24 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,pBStack_8e8);
          if (0x10 < uVar28) {
            pBVar11 = seqStore->lit;
            pBVar27 = pBVar11 + 0x10;
            ZSTD_copy16(pBVar27,pBStack_8e8 + 0x10);
            if (0x10 < (long)(uVar28 - 0x10)) {
              oend = pBVar11 + 0x20;
              do {
                op = pBStack_8e8 + 0x20;
                ZSTD_copy16(oend,op);
                ZSTD_copy16(oend + 0x10,pBStack_8e8 + 0x30);
                oend = oend + 0x20;
                pBStack_8e8 = op;
              } while (oend < pBVar27 + (uVar28 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar28;
        if (0xffff < uVar28) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar28;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar26 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar26 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_00274c4b:
        pBStack_8e8 = anchor + h;
        anchor = pBStack_8e8;
        if (pBStack_8e8 <= pBVar25) {
          pBVar11 = pBVar6 + (ulong)uVar17 + 2;
          switch(0x274cfe) {
          case 0:
            local_840 = ZSTD_hash4Ptr(pBVar11,UVar1);
            break;
          case 1:
            local_840 = ZSTD_hash5Ptr(pBVar11,UVar1);
            break;
          case 2:
            local_840 = ZSTD_hash6Ptr(pBVar11,UVar1);
            break;
          case 3:
            local_840 = ZSTD_hash7Ptr(pBVar11,UVar1);
            break;
          case 4:
            local_840 = ZSTD_hash8Ptr(pBVar11,UVar1);
          }
          pUVar5[local_840] = uVar17 + 2;
          pBStack_8e8 = pBStack_8e8 + -2;
          switch(0x274e12) {
          case 0:
            local_858 = ZSTD_hash4Ptr(pBStack_8e8,UVar1);
            break;
          case 1:
            local_858 = ZSTD_hash5Ptr(pBStack_8e8,UVar1);
            break;
          case 2:
            local_858 = ZSTD_hash6Ptr(pBStack_8e8,UVar1);
            break;
          case 3:
            local_858 = ZSTD_hash7Ptr(pBStack_8e8,UVar1);
            break;
          case 4:
            local_858 = ZSTD_hash8Ptr(pBStack_8e8,UVar1);
          }
          pUVar5[local_858] = (int)pBStack_8e8 - iVar13;
          for (; UVar14 = local_910, pBStack_8e8 = anchor, anchor <= pBVar25;
              anchor = anchor + sVar26 + 4) {
            UVar19 = (int)anchor - iVar13;
            uVar21 = UVar19 - local_910;
            if (uVar21 < uVar2) {
              local_1038 = pBVar9 + ((ulong)uVar21 - (ulong)uVar16);
            }
            else {
              local_1038 = pBVar6 + uVar21;
            }
            if ((uVar2 - 1) - uVar21 < 3) break;
            UVar20 = MEM_read32(local_1038);
            UVar22 = MEM_read32(anchor);
            if (UVar20 != UVar22) break;
            local_1048 = pBVar24;
            if (uVar21 < uVar2) {
              local_1048 = pBVar10;
            }
            sVar26 = ZSTD_count_2segments(anchor + 4,local_1038 + 4,pBVar24,local_1048,pBVar23);
            local_910 = offsetSaved;
            offsetSaved = UVar14;
            if (pBVar24 + -0x20 < anchor) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor,anchor,pBVar24 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar26 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            litLimit_w_3._0_2_ = (U16)(sVar26 + 1);
            seqStore->sequences->matchLength = (U16)litLimit_w_3;
            seqStore->sequences = seqStore->sequences + 1;
            switch(0x27541c) {
            case 0:
              local_870 = ZSTD_hash4Ptr(anchor,UVar1);
              break;
            case 1:
              local_870 = ZSTD_hash5Ptr(anchor,UVar1);
              break;
            case 2:
              local_870 = ZSTD_hash6Ptr(anchor,UVar1);
              break;
            case 3:
              local_870 = ZSTD_hash7Ptr(anchor,UVar1);
              break;
            case 4:
              local_870 = ZSTD_hash8Ptr(anchor,UVar1);
            }
            pUVar5[local_870] = UVar19;
          }
        }
      }
      goto LAB_00273bf6;
    }
    if (offsetSaved == 0) {
      local_1060 = 0;
    }
    else {
      local_1060 = offsetSaved;
    }
    *rep = local_1060;
    if (local_910 == 0) {
      local_1064 = 0;
    }
    else {
      local_1064 = local_910;
    }
    rep[1] = local_1064;
    ms_local = (ZSTD_matchState_t *)(pBVar24 + -(long)pBStack_8e8);
    break;
  case 5:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar15 = (ms->cParams).targetLength + (uint)(((ms->cParams).targetLength != 0 ^ 0xffU) & 1);
    pBVar6 = (ms->window).base;
    uVar2 = (ms->window).dictLimit;
    pBVar23 = pBVar6 + uVar2;
    pBVar24 = (BYTE *)((long)src + srcSize);
    pBVar25 = pBVar24 + -8;
    offsetSaved_1 = *rep;
    local_af0 = rep[1];
    pZVar7 = ms->dictMatchState;
    pUVar8 = pZVar7->hashTable;
    uVar3 = (pZVar7->window).dictLimit;
    pBVar9 = (pZVar7->window).base;
    pBVar10 = (pZVar7->window).nextSrc;
    uVar16 = uVar2 - ((int)pBVar10 - (int)pBVar9);
    UVar4 = (pZVar7->cParams).hashLog;
    iVar13 = (int)pBVar6;
    anchor_1 = (BYTE *)((long)src +
                       (long)(int)(uint)((iVar12 - (int)pBVar23) + (int)pBVar10 ==
                                        (int)(pBVar9 + uVar3)));
    pBStack_ac8 = (BYTE *)src;
LAB_00275800:
    UVar14 = offsetSaved_1;
    if (anchor_1 < pBVar25) {
      switch(0x275885) {
      case 0:
        local_9f0 = ZSTD_hash4Ptr(anchor_1,UVar1);
        break;
      case 1:
        local_9f0 = ZSTD_hash5Ptr(anchor_1,UVar1);
        break;
      case 2:
        local_9f0 = ZSTD_hash6Ptr(anchor_1,UVar1);
        break;
      case 3:
        local_9f0 = ZSTD_hash7Ptr(anchor_1,UVar1);
        break;
      case 4:
        local_9f0 = ZSTD_hash8Ptr(anchor_1,UVar1);
      }
      uVar17 = (int)anchor_1 - iVar13;
      uVar21 = pUVar5[local_9f0];
      pBStack_b68 = pBVar6 + uVar21;
      uVar18 = (uVar17 + 1) - offsetSaved_1;
      if (uVar18 < uVar2) {
        local_1078 = pBVar9 + (uVar18 - uVar16);
      }
      else {
        local_1078 = pBVar6 + uVar18;
      }
      pUVar5[local_9f0] = uVar17;
      if ((uVar2 - 1) - uVar18 < 3) {
LAB_00275e32:
        if (uVar2 < uVar21) {
          UVar19 = MEM_read32(pBStack_b68);
          UVar20 = MEM_read32(anchor_1);
          if (UVar19 == UVar20) {
            offsetSaved_1 = (int)anchor_1 - (int)pBStack_b68;
            sVar26 = ZSTD_count(anchor_1 + 4,pBStack_b68 + 4,pBVar24);
            h_1 = sVar26 + 4;
            while( true ) {
              bVar29 = false;
              if (pBStack_ac8 < anchor_1 && pBVar23 < pBStack_b68) {
                bVar29 = anchor_1[-1] == pBStack_b68[-1];
              }
              if (!bVar29) break;
              anchor_1 = anchor_1 + -1;
              pBStack_b68 = pBStack_b68 + -1;
              h_1 = h_1 + 1;
            }
            uVar28 = (long)anchor_1 - (long)pBStack_ac8;
            if (pBVar24 + -0x20 < pBStack_ac8 + uVar28) {
              ZSTD_safecopyLiterals(seqStore->lit,pBStack_ac8,pBStack_ac8 + uVar28,pBVar24 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,pBStack_ac8);
              if (0x10 < uVar28) {
                pBVar11 = seqStore->lit;
                pBVar27 = pBVar11 + 0x10;
                ZSTD_copy16(pBVar27,pBStack_ac8 + 0x10);
                if (0x10 < (long)(uVar28 - 0x10)) {
                  oend_6 = pBVar11 + 0x20;
                  do {
                    op_6 = pBStack_ac8 + 0x20;
                    ZSTD_copy16(oend_6,op_6);
                    ZSTD_copy16(oend_6 + 0x10,pBStack_ac8 + 0x30);
                    oend_6 = oend_6 + 0x20;
                    pBStack_ac8 = op_6;
                  } while (oend_6 < pBVar27 + (uVar28 - 0x10));
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar28;
            if (0xffff < uVar28) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar28;
            seqStore->sequences->offset = offsetSaved_1 + 3;
            if (0xffff < h_1 - 3) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(h_1 - 3);
            seqStore->sequences = seqStore->sequences + 1;
LAB_00276967:
            local_af0 = UVar14;
            goto LAB_00276969;
          }
          anchor_1 = anchor_1 + ((long)anchor_1 - (long)pBStack_ac8 >> 8) + (ulong)uVar15;
        }
        else {
          switch(0x275eb5) {
          case 0:
            local_a08 = ZSTD_hash4Ptr(anchor_1,UVar4);
            break;
          case 1:
            local_a08 = ZSTD_hash5Ptr(anchor_1,UVar4);
            break;
          case 2:
            local_a08 = ZSTD_hash6Ptr(anchor_1,UVar4);
            break;
          case 3:
            local_a08 = ZSTD_hash7Ptr(anchor_1,UVar4);
            break;
          case 4:
            local_a08 = ZSTD_hash8Ptr(anchor_1,UVar4);
          }
          uVar21 = pUVar8[local_a08];
          _offset_5 = pBVar9 + uVar21;
          if (uVar3 < uVar21) {
            UVar19 = MEM_read32(_offset_5);
            UVar20 = MEM_read32(anchor_1);
            if (UVar19 == UVar20) {
              offsetSaved_1 = (uVar17 - uVar21) - uVar16;
              sVar26 = ZSTD_count_2segments(anchor_1 + 4,_offset_5 + 4,pBVar24,pBVar10,pBVar23);
              h_1 = sVar26 + 4;
              while( true ) {
                bVar29 = false;
                if (pBStack_ac8 < anchor_1 && pBVar9 + uVar3 < _offset_5) {
                  bVar29 = anchor_1[-1] == _offset_5[-1];
                }
                if (!bVar29) break;
                anchor_1 = anchor_1 + -1;
                _offset_5 = _offset_5 + -1;
                h_1 = h_1 + 1;
              }
              uVar28 = (long)anchor_1 - (long)pBStack_ac8;
              if (pBVar24 + -0x20 < pBStack_ac8 + uVar28) {
                ZSTD_safecopyLiterals
                          (seqStore->lit,pBStack_ac8,pBStack_ac8 + uVar28,pBVar24 + -0x20);
              }
              else {
                ZSTD_copy16(seqStore->lit,pBStack_ac8);
                if (0x10 < uVar28) {
                  pBVar11 = seqStore->lit;
                  pBVar27 = pBVar11 + 0x10;
                  ZSTD_copy16(pBVar27,pBStack_ac8 + 0x10);
                  if (0x10 < (long)(uVar28 - 0x10)) {
                    oend_5 = pBVar11 + 0x20;
                    do {
                      op_5 = pBStack_ac8 + 0x20;
                      ZSTD_copy16(oend_5,op_5);
                      ZSTD_copy16(oend_5 + 0x10,pBStack_ac8 + 0x30);
                      oend_5 = oend_5 + 0x20;
                      pBStack_ac8 = op_5;
                    } while (oend_5 < pBVar27 + (uVar28 - 0x10));
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar28;
              if (0xffff < uVar28) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->litLength = (U16)uVar28;
              seqStore->sequences->offset = offsetSaved_1 + 3;
              if (0xffff < h_1 - 3) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->matchLength = (U16)(h_1 - 3);
              seqStore->sequences = seqStore->sequences + 1;
              goto LAB_00276967;
            }
          }
          anchor_1 = anchor_1 + ((long)anchor_1 - (long)pBStack_ac8 >> 8) + (ulong)uVar15;
        }
      }
      else {
        UVar19 = MEM_read32(local_1078);
        UVar20 = MEM_read32(anchor_1 + 1);
        if (UVar19 != UVar20) goto LAB_00275e32;
        local_1088 = pBVar24;
        if (uVar18 < uVar2) {
          local_1088 = pBVar10;
        }
        sVar26 = ZSTD_count_2segments(anchor_1 + 5,local_1078 + 4,pBVar24,local_1088,pBVar23);
        h_1 = sVar26 + 4;
        anchor_1 = anchor_1 + 1;
        uVar28 = (long)anchor_1 - (long)pBStack_ac8;
        if (pBVar24 + -0x20 < pBStack_ac8 + uVar28) {
          ZSTD_safecopyLiterals(seqStore->lit,pBStack_ac8,pBStack_ac8 + uVar28,pBVar24 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,pBStack_ac8);
          if (0x10 < uVar28) {
            pBVar11 = seqStore->lit;
            pBVar27 = pBVar11 + 0x10;
            ZSTD_copy16(pBVar27,pBStack_ac8 + 0x10);
            if (0x10 < (long)(uVar28 - 0x10)) {
              oend_4 = pBVar11 + 0x20;
              do {
                op_4 = pBStack_ac8 + 0x20;
                ZSTD_copy16(oend_4,op_4);
                ZSTD_copy16(oend_4 + 0x10,pBStack_ac8 + 0x30);
                oend_4 = oend_4 + 0x20;
                pBStack_ac8 = op_4;
              } while (oend_4 < pBVar27 + (uVar28 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar28;
        if (0xffff < uVar28) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar28;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar26 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar26 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_00276969:
        pBStack_ac8 = anchor_1 + h_1;
        anchor_1 = pBStack_ac8;
        if (pBStack_ac8 <= pBVar25) {
          pBVar11 = pBVar6 + (ulong)uVar17 + 2;
          switch(0x276a37) {
          case 0:
            local_a20 = ZSTD_hash4Ptr(pBVar11,UVar1);
            break;
          case 1:
            local_a20 = ZSTD_hash5Ptr(pBVar11,UVar1);
            break;
          case 2:
            local_a20 = ZSTD_hash6Ptr(pBVar11,UVar1);
            break;
          case 3:
            local_a20 = ZSTD_hash7Ptr(pBVar11,UVar1);
            break;
          case 4:
            local_a20 = ZSTD_hash8Ptr(pBVar11,UVar1);
          }
          pUVar5[local_a20] = uVar17 + 2;
          pBStack_ac8 = pBStack_ac8 + -2;
          switch(0x276b4b) {
          case 0:
            local_a38 = ZSTD_hash4Ptr(pBStack_ac8,UVar1);
            break;
          case 1:
            local_a38 = ZSTD_hash5Ptr(pBStack_ac8,UVar1);
            break;
          case 2:
            local_a38 = ZSTD_hash6Ptr(pBStack_ac8,UVar1);
            break;
          case 3:
            local_a38 = ZSTD_hash7Ptr(pBStack_ac8,UVar1);
            break;
          case 4:
            local_a38 = ZSTD_hash8Ptr(pBStack_ac8,UVar1);
          }
          pUVar5[local_a38] = (int)pBStack_ac8 - iVar13;
          for (; UVar14 = local_af0, pBStack_ac8 = anchor_1, anchor_1 <= pBVar25;
              anchor_1 = anchor_1 + sVar26 + 4) {
            UVar19 = (int)anchor_1 - iVar13;
            uVar21 = UVar19 - local_af0;
            if (uVar21 < uVar2) {
              local_10d8 = pBVar9 + ((ulong)uVar21 - (ulong)uVar16);
            }
            else {
              local_10d8 = pBVar6 + uVar21;
            }
            if ((uVar2 - 1) - uVar21 < 3) break;
            UVar20 = MEM_read32(local_10d8);
            UVar22 = MEM_read32(anchor_1);
            if (UVar20 != UVar22) break;
            local_10e8 = pBVar24;
            if (uVar21 < uVar2) {
              local_10e8 = pBVar10;
            }
            sVar26 = ZSTD_count_2segments(anchor_1 + 4,local_10d8 + 4,pBVar24,local_10e8,pBVar23);
            local_af0 = offsetSaved_1;
            offsetSaved_1 = UVar14;
            if (pBVar24 + -0x20 < anchor_1) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor_1,anchor_1,pBVar24 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor_1);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar26 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            litLimit_w_7._0_2_ = (U16)(sVar26 + 1);
            seqStore->sequences->matchLength = (U16)litLimit_w_7;
            seqStore->sequences = seqStore->sequences + 1;
            switch(0x277155) {
            case 0:
              local_a50 = ZSTD_hash4Ptr(anchor_1,UVar1);
              break;
            case 1:
              local_a50 = ZSTD_hash5Ptr(anchor_1,UVar1);
              break;
            case 2:
              local_a50 = ZSTD_hash6Ptr(anchor_1,UVar1);
              break;
            case 3:
              local_a50 = ZSTD_hash7Ptr(anchor_1,UVar1);
              break;
            case 4:
              local_a50 = ZSTD_hash8Ptr(anchor_1,UVar1);
            }
            pUVar5[local_a50] = UVar19;
          }
        }
      }
      goto LAB_00275800;
    }
    if (offsetSaved_1 == 0) {
      local_1100 = 0;
    }
    else {
      local_1100 = offsetSaved_1;
    }
    *rep = local_1100;
    if (local_af0 == 0) {
      local_1104 = 0;
    }
    else {
      local_1104 = local_af0;
    }
    rep[1] = local_1104;
    ms_local = (ZSTD_matchState_t *)(pBVar24 + -(long)pBStack_ac8);
    break;
  case 6:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar15 = (ms->cParams).targetLength + (uint)(((ms->cParams).targetLength != 0 ^ 0xffU) & 1);
    pBVar6 = (ms->window).base;
    uVar2 = (ms->window).dictLimit;
    pBVar23 = pBVar6 + uVar2;
    pBVar24 = (BYTE *)((long)src + srcSize);
    pBVar25 = pBVar24 + -8;
    offsetSaved_2 = *rep;
    local_cd0 = rep[1];
    pZVar7 = ms->dictMatchState;
    pUVar8 = pZVar7->hashTable;
    uVar3 = (pZVar7->window).dictLimit;
    pBVar9 = (pZVar7->window).base;
    pBVar10 = (pZVar7->window).nextSrc;
    uVar16 = uVar2 - ((int)pBVar10 - (int)pBVar9);
    UVar4 = (pZVar7->cParams).hashLog;
    iVar13 = (int)pBVar6;
    anchor_2 = (BYTE *)((long)src +
                       (long)(int)(uint)((iVar12 - (int)pBVar23) + (int)pBVar10 ==
                                        (int)(pBVar9 + uVar3)));
    pBStack_ca8 = (BYTE *)src;
LAB_0027751e:
    UVar14 = offsetSaved_2;
    if (anchor_2 < pBVar25) {
      switch(0x2775be) {
      case 0:
        local_bd0 = ZSTD_hash4Ptr(anchor_2,UVar1);
        break;
      case 1:
        local_bd0 = ZSTD_hash5Ptr(anchor_2,UVar1);
        break;
      case 2:
        local_bd0 = ZSTD_hash6Ptr(anchor_2,UVar1);
        break;
      case 3:
        local_bd0 = ZSTD_hash7Ptr(anchor_2,UVar1);
        break;
      case 4:
        local_bd0 = ZSTD_hash8Ptr(anchor_2,UVar1);
      }
      uVar17 = (int)anchor_2 - iVar13;
      uVar21 = pUVar5[local_bd0];
      pBStack_d48 = pBVar6 + uVar21;
      uVar18 = (uVar17 + 1) - offsetSaved_2;
      if (uVar18 < uVar2) {
        local_1118 = pBVar9 + (uVar18 - uVar16);
      }
      else {
        local_1118 = pBVar6 + uVar18;
      }
      pUVar5[local_bd0] = uVar17;
      if ((uVar2 - 1) - uVar18 < 3) {
LAB_00277b50:
        if (uVar2 < uVar21) {
          UVar19 = MEM_read32(pBStack_d48);
          UVar20 = MEM_read32(anchor_2);
          if (UVar19 == UVar20) {
            offsetSaved_2 = (int)anchor_2 - (int)pBStack_d48;
            sVar26 = ZSTD_count(anchor_2 + 4,pBStack_d48 + 4,pBVar24);
            h_2 = sVar26 + 4;
            while( true ) {
              bVar29 = false;
              if (pBStack_ca8 < anchor_2 && pBVar23 < pBStack_d48) {
                bVar29 = anchor_2[-1] == pBStack_d48[-1];
              }
              if (!bVar29) break;
              anchor_2 = anchor_2 + -1;
              pBStack_d48 = pBStack_d48 + -1;
              h_2 = h_2 + 1;
            }
            uVar28 = (long)anchor_2 - (long)pBStack_ca8;
            if (pBVar24 + -0x20 < pBStack_ca8 + uVar28) {
              ZSTD_safecopyLiterals(seqStore->lit,pBStack_ca8,pBStack_ca8 + uVar28,pBVar24 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,pBStack_ca8);
              if (0x10 < uVar28) {
                pBVar11 = seqStore->lit;
                pBVar27 = pBVar11 + 0x10;
                ZSTD_copy16(pBVar27,pBStack_ca8 + 0x10);
                if (0x10 < (long)(uVar28 - 0x10)) {
                  oend_10 = pBVar11 + 0x20;
                  do {
                    op_10 = pBStack_ca8 + 0x20;
                    ZSTD_copy16(oend_10,op_10);
                    ZSTD_copy16(oend_10 + 0x10,pBStack_ca8 + 0x30);
                    oend_10 = oend_10 + 0x20;
                    pBStack_ca8 = op_10;
                  } while (oend_10 < pBVar27 + (uVar28 - 0x10));
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar28;
            if (0xffff < uVar28) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar28;
            seqStore->sequences->offset = offsetSaved_2 + 3;
            if (0xffff < h_2 - 3) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(h_2 - 3);
            seqStore->sequences = seqStore->sequences + 1;
LAB_00278685:
            local_cd0 = UVar14;
            goto LAB_00278687;
          }
          anchor_2 = anchor_2 + ((long)anchor_2 - (long)pBStack_ca8 >> 8) + (ulong)uVar15;
        }
        else {
          switch(0x277bee) {
          case 0:
            local_be8 = ZSTD_hash4Ptr(anchor_2,UVar4);
            break;
          case 1:
            local_be8 = ZSTD_hash5Ptr(anchor_2,UVar4);
            break;
          case 2:
            local_be8 = ZSTD_hash6Ptr(anchor_2,UVar4);
            break;
          case 3:
            local_be8 = ZSTD_hash7Ptr(anchor_2,UVar4);
            break;
          case 4:
            local_be8 = ZSTD_hash8Ptr(anchor_2,UVar4);
          }
          uVar21 = pUVar8[local_be8];
          _offset_7 = pBVar9 + uVar21;
          if (uVar3 < uVar21) {
            UVar19 = MEM_read32(_offset_7);
            UVar20 = MEM_read32(anchor_2);
            if (UVar19 == UVar20) {
              offsetSaved_2 = (uVar17 - uVar21) - uVar16;
              sVar26 = ZSTD_count_2segments(anchor_2 + 4,_offset_7 + 4,pBVar24,pBVar10,pBVar23);
              h_2 = sVar26 + 4;
              while( true ) {
                bVar29 = false;
                if (pBStack_ca8 < anchor_2 && pBVar9 + uVar3 < _offset_7) {
                  bVar29 = anchor_2[-1] == _offset_7[-1];
                }
                if (!bVar29) break;
                anchor_2 = anchor_2 + -1;
                _offset_7 = _offset_7 + -1;
                h_2 = h_2 + 1;
              }
              uVar28 = (long)anchor_2 - (long)pBStack_ca8;
              if (pBVar24 + -0x20 < pBStack_ca8 + uVar28) {
                ZSTD_safecopyLiterals
                          (seqStore->lit,pBStack_ca8,pBStack_ca8 + uVar28,pBVar24 + -0x20);
              }
              else {
                ZSTD_copy16(seqStore->lit,pBStack_ca8);
                if (0x10 < uVar28) {
                  pBVar11 = seqStore->lit;
                  pBVar27 = pBVar11 + 0x10;
                  ZSTD_copy16(pBVar27,pBStack_ca8 + 0x10);
                  if (0x10 < (long)(uVar28 - 0x10)) {
                    oend_9 = pBVar11 + 0x20;
                    do {
                      op_9 = pBStack_ca8 + 0x20;
                      ZSTD_copy16(oend_9,op_9);
                      ZSTD_copy16(oend_9 + 0x10,pBStack_ca8 + 0x30);
                      oend_9 = oend_9 + 0x20;
                      pBStack_ca8 = op_9;
                    } while (oend_9 < pBVar27 + (uVar28 - 0x10));
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar28;
              if (0xffff < uVar28) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->litLength = (U16)uVar28;
              seqStore->sequences->offset = offsetSaved_2 + 3;
              if (0xffff < h_2 - 3) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->matchLength = (U16)(h_2 - 3);
              seqStore->sequences = seqStore->sequences + 1;
              goto LAB_00278685;
            }
          }
          anchor_2 = anchor_2 + ((long)anchor_2 - (long)pBStack_ca8 >> 8) + (ulong)uVar15;
        }
      }
      else {
        UVar19 = MEM_read32(local_1118);
        UVar20 = MEM_read32(anchor_2 + 1);
        if (UVar19 != UVar20) goto LAB_00277b50;
        local_1128 = pBVar24;
        if (uVar18 < uVar2) {
          local_1128 = pBVar10;
        }
        sVar26 = ZSTD_count_2segments(anchor_2 + 5,local_1118 + 4,pBVar24,local_1128,pBVar23);
        h_2 = sVar26 + 4;
        anchor_2 = anchor_2 + 1;
        uVar28 = (long)anchor_2 - (long)pBStack_ca8;
        if (pBVar24 + -0x20 < pBStack_ca8 + uVar28) {
          ZSTD_safecopyLiterals(seqStore->lit,pBStack_ca8,pBStack_ca8 + uVar28,pBVar24 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,pBStack_ca8);
          if (0x10 < uVar28) {
            pBVar11 = seqStore->lit;
            pBVar27 = pBVar11 + 0x10;
            ZSTD_copy16(pBVar27,pBStack_ca8 + 0x10);
            if (0x10 < (long)(uVar28 - 0x10)) {
              oend_8 = pBVar11 + 0x20;
              do {
                op_8 = pBStack_ca8 + 0x20;
                ZSTD_copy16(oend_8,op_8);
                ZSTD_copy16(oend_8 + 0x10,pBStack_ca8 + 0x30);
                oend_8 = oend_8 + 0x20;
                pBStack_ca8 = op_8;
              } while (oend_8 < pBVar27 + (uVar28 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar28;
        if (0xffff < uVar28) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar28;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar26 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar26 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_00278687:
        pBStack_ca8 = anchor_2 + h_2;
        anchor_2 = pBStack_ca8;
        if (pBStack_ca8 <= pBVar25) {
          pBVar11 = pBVar6 + (ulong)uVar17 + 2;
          switch(0x278770) {
          case 0:
            local_c00 = ZSTD_hash4Ptr(pBVar11,UVar1);
            break;
          case 1:
            local_c00 = ZSTD_hash5Ptr(pBVar11,UVar1);
            break;
          case 2:
            local_c00 = ZSTD_hash6Ptr(pBVar11,UVar1);
            break;
          case 3:
            local_c00 = ZSTD_hash7Ptr(pBVar11,UVar1);
            break;
          case 4:
            local_c00 = ZSTD_hash8Ptr(pBVar11,UVar1);
          }
          pUVar5[local_c00] = uVar17 + 2;
          pBStack_ca8 = pBStack_ca8 + -2;
          switch(0x278884) {
          case 0:
            local_c18 = ZSTD_hash4Ptr(pBStack_ca8,UVar1);
            break;
          case 1:
            local_c18 = ZSTD_hash5Ptr(pBStack_ca8,UVar1);
            break;
          case 2:
            local_c18 = ZSTD_hash6Ptr(pBStack_ca8,UVar1);
            break;
          case 3:
            local_c18 = ZSTD_hash7Ptr(pBStack_ca8,UVar1);
            break;
          case 4:
            local_c18 = ZSTD_hash8Ptr(pBStack_ca8,UVar1);
          }
          pUVar5[local_c18] = (int)pBStack_ca8 - iVar13;
          for (; UVar14 = local_cd0, pBStack_ca8 = anchor_2, anchor_2 <= pBVar25;
              anchor_2 = anchor_2 + sVar26 + 4) {
            UVar19 = (int)anchor_2 - iVar13;
            uVar21 = UVar19 - local_cd0;
            if (uVar21 < uVar2) {
              local_1178 = pBVar9 + ((ulong)uVar21 - (ulong)uVar16);
            }
            else {
              local_1178 = pBVar6 + uVar21;
            }
            if ((uVar2 - 1) - uVar21 < 3) break;
            UVar20 = MEM_read32(local_1178);
            UVar22 = MEM_read32(anchor_2);
            if (UVar20 != UVar22) break;
            local_1188 = pBVar24;
            if (uVar21 < uVar2) {
              local_1188 = pBVar10;
            }
            sVar26 = ZSTD_count_2segments(anchor_2 + 4,local_1178 + 4,pBVar24,local_1188,pBVar23);
            local_cd0 = offsetSaved_2;
            offsetSaved_2 = UVar14;
            if (pBVar24 + -0x20 < anchor_2) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor_2,anchor_2,pBVar24 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor_2);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar26 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            litLimit_w_11._0_2_ = (U16)(sVar26 + 1);
            seqStore->sequences->matchLength = (U16)litLimit_w_11;
            seqStore->sequences = seqStore->sequences + 1;
            switch(0x278e8e) {
            case 0:
              local_c30 = ZSTD_hash4Ptr(anchor_2,UVar1);
              break;
            case 1:
              local_c30 = ZSTD_hash5Ptr(anchor_2,UVar1);
              break;
            case 2:
              local_c30 = ZSTD_hash6Ptr(anchor_2,UVar1);
              break;
            case 3:
              local_c30 = ZSTD_hash7Ptr(anchor_2,UVar1);
              break;
            case 4:
              local_c30 = ZSTD_hash8Ptr(anchor_2,UVar1);
            }
            pUVar5[local_c30] = UVar19;
          }
        }
      }
      goto LAB_0027751e;
    }
    if (offsetSaved_2 == 0) {
      local_11a0 = 0;
    }
    else {
      local_11a0 = offsetSaved_2;
    }
    *rep = local_11a0;
    if (local_cd0 == 0) {
      local_11a4 = 0;
    }
    else {
      local_11a4 = local_cd0;
    }
    rep[1] = local_11a4;
    ms_local = (ZSTD_matchState_t *)(pBVar24 + -(long)pBStack_ca8);
    break;
  case 7:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar15 = (ms->cParams).targetLength + (uint)(((ms->cParams).targetLength != 0 ^ 0xffU) & 1);
    pBVar6 = (ms->window).base;
    uVar2 = (ms->window).dictLimit;
    pBVar23 = pBVar6 + uVar2;
    pBVar24 = (BYTE *)((long)src + srcSize);
    pBVar25 = pBVar24 + -8;
    offsetSaved_3 = *rep;
    local_eb0 = rep[1];
    pZVar7 = ms->dictMatchState;
    pUVar8 = pZVar7->hashTable;
    uVar3 = (pZVar7->window).dictLimit;
    pBVar9 = (pZVar7->window).base;
    pBVar10 = (pZVar7->window).nextSrc;
    uVar16 = uVar2 - ((int)pBVar10 - (int)pBVar9);
    UVar4 = (pZVar7->cParams).hashLog;
    iVar13 = (int)pBVar6;
    anchor_3 = (BYTE *)((long)src +
                       (long)(int)(uint)((iVar12 - (int)pBVar23) + (int)pBVar10 ==
                                        (int)(pBVar9 + uVar3)));
    pBStack_e88 = (BYTE *)src;
LAB_0027923c:
    UVar14 = offsetSaved_3;
    if (anchor_3 < pBVar25) {
      switch(0x2792f7) {
      case 0:
        local_db0 = ZSTD_hash4Ptr(anchor_3,UVar1);
        break;
      case 1:
        local_db0 = ZSTD_hash5Ptr(anchor_3,UVar1);
        break;
      case 2:
        local_db0 = ZSTD_hash6Ptr(anchor_3,UVar1);
        break;
      case 3:
        local_db0 = ZSTD_hash7Ptr(anchor_3,UVar1);
        break;
      case 4:
        local_db0 = ZSTD_hash8Ptr(anchor_3,UVar1);
      }
      uVar17 = (int)anchor_3 - iVar13;
      uVar21 = pUVar5[local_db0];
      pBStack_f28 = pBVar6 + uVar21;
      uVar18 = (uVar17 + 1) - offsetSaved_3;
      if (uVar18 < uVar2) {
        local_11b8 = pBVar9 + (uVar18 - uVar16);
      }
      else {
        local_11b8 = pBVar6 + uVar18;
      }
      pUVar5[local_db0] = uVar17;
      if ((uVar2 - 1) - uVar18 < 3) {
LAB_0027986e:
        if (uVar2 < uVar21) {
          UVar19 = MEM_read32(pBStack_f28);
          UVar20 = MEM_read32(anchor_3);
          if (UVar19 == UVar20) {
            offsetSaved_3 = (int)anchor_3 - (int)pBStack_f28;
            sVar26 = ZSTD_count(anchor_3 + 4,pBStack_f28 + 4,pBVar24);
            h_3 = sVar26 + 4;
            while( true ) {
              bVar29 = false;
              if (pBStack_e88 < anchor_3 && pBVar23 < pBStack_f28) {
                bVar29 = anchor_3[-1] == pBStack_f28[-1];
              }
              if (!bVar29) break;
              anchor_3 = anchor_3 + -1;
              pBStack_f28 = pBStack_f28 + -1;
              h_3 = h_3 + 1;
            }
            uVar28 = (long)anchor_3 - (long)pBStack_e88;
            if (pBVar24 + -0x20 < pBStack_e88 + uVar28) {
              ZSTD_safecopyLiterals(seqStore->lit,pBStack_e88,pBStack_e88 + uVar28,pBVar24 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,pBStack_e88);
              if (0x10 < uVar28) {
                pBVar11 = seqStore->lit;
                pBVar27 = pBVar11 + 0x10;
                ZSTD_copy16(pBVar27,pBStack_e88 + 0x10);
                if (0x10 < (long)(uVar28 - 0x10)) {
                  oend_14 = pBVar11 + 0x20;
                  do {
                    op_14 = pBStack_e88 + 0x20;
                    ZSTD_copy16(oend_14,op_14);
                    ZSTD_copy16(oend_14 + 0x10,pBStack_e88 + 0x30);
                    oend_14 = oend_14 + 0x20;
                    pBStack_e88 = op_14;
                  } while (oend_14 < pBVar27 + (uVar28 - 0x10));
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar28;
            if (0xffff < uVar28) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar28;
            seqStore->sequences->offset = offsetSaved_3 + 3;
            if (0xffff < h_3 - 3) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(h_3 - 3);
            seqStore->sequences = seqStore->sequences + 1;
LAB_0027a3a3:
            local_eb0 = UVar14;
            goto LAB_0027a3a5;
          }
          anchor_3 = anchor_3 + ((long)anchor_3 - (long)pBStack_e88 >> 8) + (ulong)uVar15;
        }
        else {
          switch(0x279927) {
          case 0:
            local_dc8 = ZSTD_hash4Ptr(anchor_3,UVar4);
            break;
          case 1:
            local_dc8 = ZSTD_hash5Ptr(anchor_3,UVar4);
            break;
          case 2:
            local_dc8 = ZSTD_hash6Ptr(anchor_3,UVar4);
            break;
          case 3:
            local_dc8 = ZSTD_hash7Ptr(anchor_3,UVar4);
            break;
          case 4:
            local_dc8 = ZSTD_hash8Ptr(anchor_3,UVar4);
          }
          uVar21 = pUVar8[local_dc8];
          _offset_9 = pBVar9 + uVar21;
          if (uVar3 < uVar21) {
            UVar19 = MEM_read32(_offset_9);
            UVar20 = MEM_read32(anchor_3);
            if (UVar19 == UVar20) {
              offsetSaved_3 = (uVar17 - uVar21) - uVar16;
              sVar26 = ZSTD_count_2segments(anchor_3 + 4,_offset_9 + 4,pBVar24,pBVar10,pBVar23);
              h_3 = sVar26 + 4;
              while( true ) {
                bVar29 = false;
                if (pBStack_e88 < anchor_3 && pBVar9 + uVar3 < _offset_9) {
                  bVar29 = anchor_3[-1] == _offset_9[-1];
                }
                if (!bVar29) break;
                anchor_3 = anchor_3 + -1;
                _offset_9 = _offset_9 + -1;
                h_3 = h_3 + 1;
              }
              uVar28 = (long)anchor_3 - (long)pBStack_e88;
              if (pBVar24 + -0x20 < pBStack_e88 + uVar28) {
                ZSTD_safecopyLiterals
                          (seqStore->lit,pBStack_e88,pBStack_e88 + uVar28,pBVar24 + -0x20);
              }
              else {
                ZSTD_copy16(seqStore->lit,pBStack_e88);
                if (0x10 < uVar28) {
                  pBVar11 = seqStore->lit;
                  pBVar27 = pBVar11 + 0x10;
                  ZSTD_copy16(pBVar27,pBStack_e88 + 0x10);
                  if (0x10 < (long)(uVar28 - 0x10)) {
                    oend_13 = pBVar11 + 0x20;
                    do {
                      op_13 = pBStack_e88 + 0x20;
                      ZSTD_copy16(oend_13,op_13);
                      ZSTD_copy16(oend_13 + 0x10,pBStack_e88 + 0x30);
                      oend_13 = oend_13 + 0x20;
                      pBStack_e88 = op_13;
                    } while (oend_13 < pBVar27 + (uVar28 - 0x10));
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar28;
              if (0xffff < uVar28) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->litLength = (U16)uVar28;
              seqStore->sequences->offset = offsetSaved_3 + 3;
              if (0xffff < h_3 - 3) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->matchLength = (U16)(h_3 - 3);
              seqStore->sequences = seqStore->sequences + 1;
              goto LAB_0027a3a3;
            }
          }
          anchor_3 = anchor_3 + ((long)anchor_3 - (long)pBStack_e88 >> 8) + (ulong)uVar15;
        }
      }
      else {
        UVar19 = MEM_read32(local_11b8);
        UVar20 = MEM_read32(anchor_3 + 1);
        if (UVar19 != UVar20) goto LAB_0027986e;
        local_11c8 = pBVar24;
        if (uVar18 < uVar2) {
          local_11c8 = pBVar10;
        }
        sVar26 = ZSTD_count_2segments(anchor_3 + 5,local_11b8 + 4,pBVar24,local_11c8,pBVar23);
        h_3 = sVar26 + 4;
        anchor_3 = anchor_3 + 1;
        uVar28 = (long)anchor_3 - (long)pBStack_e88;
        if (pBVar24 + -0x20 < pBStack_e88 + uVar28) {
          ZSTD_safecopyLiterals(seqStore->lit,pBStack_e88,pBStack_e88 + uVar28,pBVar24 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,pBStack_e88);
          if (0x10 < uVar28) {
            pBVar11 = seqStore->lit;
            pBVar27 = pBVar11 + 0x10;
            ZSTD_copy16(pBVar27,pBStack_e88 + 0x10);
            if (0x10 < (long)(uVar28 - 0x10)) {
              oend_12 = pBVar11 + 0x20;
              do {
                op_12 = pBStack_e88 + 0x20;
                ZSTD_copy16(oend_12,op_12);
                ZSTD_copy16(oend_12 + 0x10,pBStack_e88 + 0x30);
                oend_12 = oend_12 + 0x20;
                pBStack_e88 = op_12;
              } while (oend_12 < pBVar27 + (uVar28 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar28;
        if (0xffff < uVar28) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar28;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar26 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar26 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_0027a3a5:
        pBStack_e88 = anchor_3 + h_3;
        anchor_3 = pBStack_e88;
        if (pBStack_e88 <= pBVar25) {
          pBVar11 = pBVar6 + (ulong)uVar17 + 2;
          switch(0x27a4a9) {
          case 0:
            local_de0 = ZSTD_hash4Ptr(pBVar11,UVar1);
            break;
          case 1:
            local_de0 = ZSTD_hash5Ptr(pBVar11,UVar1);
            break;
          case 2:
            local_de0 = ZSTD_hash6Ptr(pBVar11,UVar1);
            break;
          case 3:
            local_de0 = ZSTD_hash7Ptr(pBVar11,UVar1);
            break;
          case 4:
            local_de0 = ZSTD_hash8Ptr(pBVar11,UVar1);
          }
          pUVar5[local_de0] = uVar17 + 2;
          pBStack_e88 = pBStack_e88 + -2;
          switch(0x27a5bd) {
          case 0:
            local_df8 = ZSTD_hash4Ptr(pBStack_e88,UVar1);
            break;
          case 1:
            local_df8 = ZSTD_hash5Ptr(pBStack_e88,UVar1);
            break;
          case 2:
            local_df8 = ZSTD_hash6Ptr(pBStack_e88,UVar1);
            break;
          case 3:
            local_df8 = ZSTD_hash7Ptr(pBStack_e88,UVar1);
            break;
          case 4:
            local_df8 = ZSTD_hash8Ptr(pBStack_e88,UVar1);
          }
          pUVar5[local_df8] = (int)pBStack_e88 - iVar13;
          for (; UVar14 = local_eb0, pBStack_e88 = anchor_3, anchor_3 <= pBVar25;
              anchor_3 = anchor_3 + sVar26 + 4) {
            UVar19 = (int)anchor_3 - iVar13;
            uVar21 = UVar19 - local_eb0;
            if (uVar21 < uVar2) {
              local_1218 = pBVar9 + ((ulong)uVar21 - (ulong)uVar16);
            }
            else {
              local_1218 = pBVar6 + uVar21;
            }
            if ((uVar2 - 1) - uVar21 < 3) break;
            UVar20 = MEM_read32(local_1218);
            UVar22 = MEM_read32(anchor_3);
            if (UVar20 != UVar22) break;
            local_1228 = pBVar24;
            if (uVar21 < uVar2) {
              local_1228 = pBVar10;
            }
            sVar26 = ZSTD_count_2segments(anchor_3 + 4,local_1218 + 4,pBVar24,local_1228,pBVar23);
            local_eb0 = offsetSaved_3;
            offsetSaved_3 = UVar14;
            if (pBVar24 + -0x20 < anchor_3) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor_3,anchor_3,pBVar24 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor_3);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar26 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            litLimit_w_15._0_2_ = (U16)(sVar26 + 1);
            seqStore->sequences->matchLength = (U16)litLimit_w_15;
            seqStore->sequences = seqStore->sequences + 1;
            switch(0x27abc7) {
            case 0:
              local_e10 = ZSTD_hash4Ptr(anchor_3,UVar1);
              break;
            case 1:
              local_e10 = ZSTD_hash5Ptr(anchor_3,UVar1);
              break;
            case 2:
              local_e10 = ZSTD_hash6Ptr(anchor_3,UVar1);
              break;
            case 3:
              local_e10 = ZSTD_hash7Ptr(anchor_3,UVar1);
              break;
            case 4:
              local_e10 = ZSTD_hash8Ptr(anchor_3,UVar1);
            }
            pUVar5[local_e10] = UVar19;
          }
        }
      }
      goto LAB_0027923c;
    }
    if (offsetSaved_3 == 0) {
      local_1240 = 0;
    }
    else {
      local_1240 = offsetSaved_3;
    }
    *rep = local_1240;
    if (local_eb0 == 0) {
      local_1244 = 0;
    }
    else {
      local_1244 = local_eb0;
    }
    rep[1] = local_1244;
    ms_local = (ZSTD_matchState_t *)(pBVar24 + -(long)pBStack_e88);
  }
  return (size_t)ms_local;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}